

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

bool Ptex::v2_2::memCompare(char *a,char *b,int len)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (long)(int)(len & 0xfffffff8);
  lVar5 = 0;
  do {
    if (lVar4 <= lVar5) {
      iVar3 = bcmp(a + lVar4,b + lVar4,(ulong)(len & 7));
      return iVar3 != 0;
    }
    plVar1 = (long *)(a + lVar5);
    plVar2 = (long *)(b + lVar5);
    lVar5 = lVar5 + 8;
  } while (*plVar1 == *plVar2);
  return true;
}

Assistant:

inline bool memCompare(const char* a, const char* b, int len)
{
    int len64 = len & ~7;
    uint64_t val64[2];
    for (int i = 0; i < len64; i+=8) {
        memcpy(&val64[0], &a[i], 8);
        memcpy(&val64[1], &b[i], 8);
        if (val64[0] != val64[1]) return 1;
    }
    return memcmp(&a[len64], &b[len64], len & 7);
}